

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra.c
# Opt level: O1

Byte * z7_BranchConv_SPARC_Dec(Byte *data,SizeT size,UInt32 pc)

{
  uint *in_RAX;
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  uint *puVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  puVar2 = (uint *)(data + (size & 0xfffffffffffffffc));
  iVar3 = (int)data;
  do {
    iVar5 = (pc - iVar3) + -0x1000003 + (int)data;
    do {
      puVar4 = (uint *)data;
      puVar1 = puVar4;
      data = (Byte *)puVar4;
      if (puVar4 == puVar2) goto LAB_00194e9a;
      uVar6 = *puVar4;
      uVar6 = (uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18) << 2
              | (uVar6 << 0x18) >> 0x1e;
      iVar5 = iVar5 + 4;
      data = (Byte *)(puVar4 + 1);
    } while ((uVar6 + 0xffffff & 0xfe000003) != 0);
    uVar7 = (uVar6 - iVar5 & 0x1ffffff) - 0xffffff;
    uVar6 = uVar7 >> 2;
    *puVar4 = (uVar7 * 0x40000000 | uVar6) >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8
              | uVar6 << 0x18;
    puVar1 = in_RAX;
LAB_00194e9a:
    in_RAX = puVar1;
    if (puVar4 == puVar2) {
      return (Byte *)puVar1;
    }
  } while( true );
}

Assistant:

Z7_BRANCH_FUNC_MAIN(BranchConv_SPARC)
{
  // Byte *p = data;
  const Byte *lim;
  const UInt32 flag = (UInt32)1 << 22;
  size &= ~(SizeT)3;
  lim = p + size;
  BR_PC_INIT
  pc -= 4;  // because (p) will point to next instruction
  for (;;)
  {
    UInt32 v;
    for (;;)
    {
      if Z7_UNLIKELY(p == lim)
        return p;
      /* // the code without GetBe32a():
      { const UInt32 v = GetUi16a(p) & 0xc0ff; p += 4; if (v == 0x40 || v == 0xc07f) break; }
      */
      v = GetBe32a(p);
      p += 4;
    #ifdef BR_SPARC_USE_ROTATE
      v = rotlFixed(v, 2);
      v += (flag << 2) - 1;
      if Z7_UNLIKELY((v & (3 - (flag << 3))) == 0)
    #else
      v += (UInt32)5 << 29;
      v ^= (UInt32)7 << 29;
      v += flag;
      if Z7_UNLIKELY((v & (0 - (flag << 1))) == 0)
    #endif
        break;
    }
    {
      // UInt32 v = GetBe32a(p - 4);
    #ifndef BR_SPARC_USE_ROTATE
      v <<= 2;
    #endif
      {
        UInt32 c = BR_PC_GET;
        BR_CONVERT_VAL(v, c)
      }
      v &= (flag << 3) - 1;
    #ifdef BR_SPARC_USE_ROTATE
      v -= (flag << 2) - 1;
      v = rotrFixed(v, 2);
    #else
      v -= (flag << 2);
      v >>= 2;
      v |= (UInt32)1 << 30;
    #endif
      SetBe32a(p - 4, v)
    }
  }
}